

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O2

int __thiscall CASC_CSV::GetString(CASC_CSV *this,char *szBufferPtr,size_t nMaxChars,size_t Index)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  iVar3 = 0x69;
  if (Index < this->nColumns) {
    uVar2 = this->Columns[Index].nLength;
    if (uVar2 <= nMaxChars - 1) {
      pcVar4 = szBufferPtr + (nMaxChars - 1);
      pcVar5 = this->Columns[Index].szString;
      pcVar6 = pcVar5 + uVar2;
      for (; (pcVar5 < pcVar6 && (szBufferPtr < pcVar4)); szBufferPtr = szBufferPtr + 1) {
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + 1;
        *szBufferPtr = cVar1;
      }
      *szBufferPtr = '\0';
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int CASC_CSV::GetString(char * szBufferPtr, size_t nMaxChars, size_t Index)
{
    const char * szStringPtr;
    const char * szStringEnd;
    char * szBufferEnd = szBufferPtr + nMaxChars - 1;

    // Check for index overflow and buffer overflow
    if (Index >= nColumns)
        return ERROR_INSUFFICIENT_BUFFER;
    if (Columns[Index].nLength > nMaxChars - 1)
        return ERROR_INSUFFICIENT_BUFFER;
    
    // Get the source string
    szStringPtr = Columns[Index].szString;
    szStringEnd = szStringPtr + Columns[Index].nLength;

    // Copy the string
    while (szStringPtr < szStringEnd && szBufferPtr < szBufferEnd)
        *szBufferPtr++ = *szStringPtr++;
    szBufferPtr[0] = 0;
    return ERROR_SUCCESS;
}